

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjuliancalendar.cpp
# Opt level: O2

bool __thiscall
QJulianCalendar::dateToJulianDay(QJulianCalendar *this,int year,int month,int day,qint64 *jd)

{
  int iVar1;
  R_conflict18 RVar2;
  
  iVar1 = (*(this->super_QRomanCalendar).super_QCalendarBackend._vptr_QCalendarBackend[6])();
  if (SUB41(iVar1,0) != false) {
    RVar2 = QRomanCalendrical::yearMonthToYearDays(year,month);
    *jd = (RVar2.year * 0x5b5 >> 2) + (long)day + RVar2.days + 0x1a431d;
  }
  return SUB41(iVar1,0);
}

Assistant:

bool QJulianCalendar::dateToJulianDay(int year, int month, int day, qint64 *jd) const
{
    Q_ASSERT(jd);
    if (!isDateValid(year, month, day))
        return false;

    const auto yearDays = yearMonthToYearDays(year, month);
    *jd = qDiv<4>(FourYears * yearDays.year) + yearDays.days + day + JulianBaseJd;
    return true;
}